

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelbin.cpp
# Opt level: O1

Mat * __thiscall
ncnn::ModelBin::load(Mat *__return_storage_ptr__,ModelBin *this,int w,int h,int type)

{
  long lVar1;
  uint uVar2;
  Mat m;
  void *local_68;
  int *local_60;
  size_t local_58;
  int local_50;
  Allocator *local_48;
  int local_40;
  int iStack_3c;
  int iStack_38;
  int iStack_34;
  size_t local_30;
  
  uVar2 = h * w;
  (*this->_vptr_ModelBin[2])(&local_68,this,(ulong)uVar2,type);
  if ((local_68 == (void *)0x0) || ((long)iStack_34 * local_30 == 0)) {
    __return_storage_ptr__->data = local_68;
    __return_storage_ptr__->refcount = local_60;
    __return_storage_ptr__->elemsize = local_58;
    __return_storage_ptr__->elempack = local_50;
    __return_storage_ptr__->allocator = local_48;
    __return_storage_ptr__->dims = local_40;
    __return_storage_ptr__->w = iStack_3c;
    __return_storage_ptr__->h = iStack_38;
    __return_storage_ptr__->c = iStack_34;
    __return_storage_ptr__->cstep = local_30;
    if (local_60 != (int *)0x0) {
      LOCK();
      *local_60 = *local_60 + 1;
      UNLOCK();
    }
  }
  else if (iStack_38 * iStack_3c * iStack_34 == uVar2) {
    if ((local_40 == 3) && (local_30 != (long)iStack_38 * (long)iStack_3c)) {
      *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
      __return_storage_ptr__->data = (void *)0x0;
      __return_storage_ptr__->refcount = (int *)0x0;
      __return_storage_ptr__->allocator = (Allocator *)0x0;
      __return_storage_ptr__->dims = 0;
      __return_storage_ptr__->w = 0;
      __return_storage_ptr__->h = 0;
      __return_storage_ptr__->c = 0;
      __return_storage_ptr__->cstep = 0;
      Mat::create(__return_storage_ptr__,w,h,local_58,local_50,(Allocator *)0x0);
      if (0 < iStack_34) {
        lVar1 = 0;
        do {
          memcpy((void *)((long)((int)lVar1 * iStack_38 * iStack_3c) * local_58 +
                         (long)__return_storage_ptr__->data),
                 (void *)(local_30 * lVar1 * local_58 + (long)local_68),
                 (long)(iStack_38 * iStack_3c) * local_58);
          lVar1 = lVar1 + 1;
        } while (lVar1 < iStack_34);
      }
    }
    else {
      __return_storage_ptr__->data = local_68;
      __return_storage_ptr__->refcount = local_60;
      __return_storage_ptr__->elemsize = local_58;
      __return_storage_ptr__->elempack = local_50;
      __return_storage_ptr__->allocator = local_48;
      __return_storage_ptr__->dims = local_40;
      __return_storage_ptr__->w = iStack_3c;
      __return_storage_ptr__->h = iStack_38;
      __return_storage_ptr__->c = iStack_34;
      __return_storage_ptr__->cstep = local_30;
      if (local_60 != (int *)0x0) {
        LOCK();
        *local_60 = *local_60 + 1;
        UNLOCK();
      }
      __return_storage_ptr__->dims = 2;
      __return_storage_ptr__->w = w;
      __return_storage_ptr__->h = h;
      __return_storage_ptr__->c = 1;
      __return_storage_ptr__->cstep = (long)(int)uVar2;
    }
  }
  else {
    *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
    __return_storage_ptr__->data = (void *)0x0;
    __return_storage_ptr__->refcount = (int *)0x0;
    __return_storage_ptr__->allocator = (Allocator *)0x0;
    __return_storage_ptr__->dims = 0;
    __return_storage_ptr__->w = 0;
    __return_storage_ptr__->h = 0;
    __return_storage_ptr__->c = 0;
    __return_storage_ptr__->cstep = 0;
  }
  if (local_60 != (int *)0x0) {
    LOCK();
    *local_60 = *local_60 + -1;
    UNLOCK();
    if (*local_60 == 0) {
      if (local_48 == (Allocator *)0x0) {
        if (local_68 != (void *)0x0) {
          free(local_68);
        }
      }
      else {
        (**(code **)(*(long *)local_48 + 0x18))();
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Mat ModelBin::load(int w, int h, int type) const
{
    Mat m = load(w * h, type);
    if (m.empty())
        return m;

    return m.reshape(w, h);
}